

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void disableCursor(_GLFWwindow *window)

{
  Window WVar1;
  XIEventMask em;
  uchar local_24 [4];
  XIEventMask local_20;
  
  if (window->rawMouseMotion != 0) {
    local_20.mask = local_24;
    local_24[0] = '\0';
    local_24[1] = '\0';
    local_20.deviceid = 1;
    local_20.mask_len = 3;
    local_24[2] = 2;
    (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&local_20,1);
  }
  _glfw.x11.disabledCursorWindow = window;
  _glfwGetCursorPosX11(window,&_glfw.x11.restoreCursorPosX,&_glfw.x11.restoreCursorPosY);
  updateCursorImage(window);
  _glfwCenterCursorInContentArea(window);
  WVar1 = (window->x11).handle;
  (*_glfw.x11.xlib.GrabPointer)(_glfw.x11.display,WVar1,1,0x4c,1,1,WVar1,0,0);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        enableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = window;
    _glfwGetCursorPosX11(window,
                         &_glfw.x11.restoreCursorPosX,
                         &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    _glfwCenterCursorInContentArea(window);
    captureCursor(window);
}